

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::writeIdenticalLevel
          (RuleBasedCollator *this,UChar *s,UChar *limit,SortKeyByteSink *sink,UErrorCode *errorCode
          )

{
  undefined4 prev_00;
  UBool UVar1;
  int32_t length;
  UChar *src;
  char16_t *s_00;
  undefined1 local_80 [8];
  UnicodeString nfd;
  int32_t destLengthEstimate;
  UChar32 prev;
  UChar *nfdQCYesLimit;
  UErrorCode *errorCode_local;
  SortKeyByteSink *sink_local;
  UChar *limit_local;
  UChar *s_local;
  RuleBasedCollator *this_local;
  
  src = Normalizer2Impl::decompose(this->data->nfcImpl,s,limit,(ReorderingBuffer *)0x0,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    SortKeyByteSink::Append(sink,1);
    nfd.fUnion._52_4_ = 0;
    if (src != s) {
      nfd.fUnion._52_4_ =
           u_writeIdenticalLevelRun_63
                     (0,s,(int32_t)((long)src - (long)s >> 1),&sink->super_ByteSink);
    }
    if (limit == (UChar *)0x0) {
      if (*src == L'\0') {
        return;
      }
      nfd.fUnion._48_4_ = 0xffffffff;
    }
    else {
      if (src == limit) {
        return;
      }
      nfd.fUnion._48_4_ = (undefined4)((long)limit - (long)src >> 1);
    }
    UnicodeString::UnicodeString((UnicodeString *)local_80);
    Normalizer2Impl::decompose
              (this->data->nfcImpl,src,limit,(UnicodeString *)local_80,nfd.fUnion._48_4_,errorCode);
    prev_00 = nfd.fUnion._52_4_;
    s_00 = UnicodeString::getBuffer((UnicodeString *)local_80);
    length = UnicodeString::length((UnicodeString *)local_80);
    u_writeIdenticalLevelRun_63(prev_00,s_00,length,&sink->super_ByteSink);
    UnicodeString::~UnicodeString((UnicodeString *)local_80);
  }
  return;
}

Assistant:

void
RuleBasedCollator::writeIdenticalLevel(const UChar *s, const UChar *limit,
                                       SortKeyByteSink &sink, UErrorCode &errorCode) const {
    // NFD quick check
    const UChar *nfdQCYesLimit = data->nfcImpl.decompose(s, limit, NULL, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
    UChar32 prev = 0;
    if(nfdQCYesLimit != s) {
        prev = u_writeIdenticalLevelRun(prev, s, (int32_t)(nfdQCYesLimit - s), sink);
    }
    // Is there non-NFD text?
    int32_t destLengthEstimate;
    if(limit != NULL) {
        if(nfdQCYesLimit == limit) { return; }
        destLengthEstimate = (int32_t)(limit - nfdQCYesLimit);
    } else {
        // s is NUL-terminated
        if(*nfdQCYesLimit == 0) { return; }
        destLengthEstimate = -1;
    }
    UnicodeString nfd;
    data->nfcImpl.decompose(nfdQCYesLimit, limit, nfd, destLengthEstimate, errorCode);
    u_writeIdenticalLevelRun(prev, nfd.getBuffer(), nfd.length(), sink);
}